

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int get_request_len(char *s,int buf_len)

{
  byte bVar1;
  ushort **ppuVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar3 = 0;
  if (0 < buf_len) {
    uVar3 = (ulong)(uint)buf_len;
  }
  uVar5 = 2;
  iVar4 = 1;
  do {
    if (uVar5 - uVar3 == 2) {
      return 0;
    }
    ppuVar2 = __ctype_b_loc();
    bVar1 = s[uVar5 - 2];
    if ((((bVar1 != 10) && (-1 < (char)bVar1)) && (bVar1 != 0xd)) &&
       (((*ppuVar2)[bVar1] & 0x4000) == 0)) {
      return -1;
    }
    if (bVar1 == 10) {
      if ((iVar4 < buf_len) && (s[uVar5 - 1] == '\n')) {
LAB_0010b91c:
        return (int)uVar5;
      }
      if (((int)uVar5 < buf_len) && ((s[uVar5 - 1] == '\r' && (s[uVar5] == '\n')))) {
        uVar5 = (ulong)((int)uVar5 + 1);
        goto LAB_0010b91c;
      }
    }
    uVar5 = uVar5 + 1;
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

static int get_request_len(const char *s, int buf_len) {
    const unsigned char *buf = (unsigned char *) s;
    int i;

    for (i = 0; i < buf_len; i++) {
        if (!isprint(buf[i]) && buf[i] != '\r' && buf[i] != '\n' && buf[i] < 128) {
            return -1;
        } else if (buf[i] == '\n' && i + 1 < buf_len && buf[i + 1] == '\n') {
            return i + 2;
        } else if (buf[i] == '\n' && i + 2 < buf_len && buf[i + 1] == '\r' &&
                   buf[i + 2] == '\n') {
            return i + 3;
        }
    }

    return 0;
}